

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reassociation.cpp
# Opt level: O3

shared_ptr<mocker::detail::ReassociationImpl::Node> __thiscall
mocker::detail::ReassociationImpl::buildTrees
          (ReassociationImpl *this,shared_ptr<mocker::ir::Addr> *node,bool firstNode)

{
  _func_int **pp_Var1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  BasicBlock *pBVar3;
  char cVar4;
  element_type *peVar5;
  bool bVar6;
  int iVar7;
  const_iterator cVar8;
  const_iterator cVar9;
  char in_CL;
  undefined7 in_register_00000011;
  IntLiteral *addr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  shared_ptr<mocker::ir::IntLiteral> sVar11;
  shared_ptr<mocker::ir::Reg> sVar12;
  shared_ptr<mocker::detail::ReassociationImpl::Node> sVar13;
  shared_ptr<mocker::ir::Reg> reg;
  undefined1 local_51;
  undefined1 local_50 [16];
  shared_ptr<mocker::ir::Addr> local_40;
  
  addr = (IntLiteral *)CONCAT71(in_register_00000011,firstNode);
  sVar11 = ir::detail::dyc_impl<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>const&>
                     (&local_40,addr);
  peVar5 = local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var10 = sVar11.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if ((DefUseChain *)
      local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (DefUseChain *)0x0) {
    local_50._0_4_ = Literal;
    this->bb = (BasicBlock *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::detail::ReassociationImpl::Node,std::allocator<mocker::detail::ReassociationImpl::Node>,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::IntLiteral>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->func,(Node **)this,
               (allocator<mocker::detail::ReassociationImpl::Node> *)&local_51,(Type *)local_50,
               (shared_ptr<mocker::ir::IntLiteral> *)&local_40);
    _Var10._M_pi = extraout_RDX;
  }
  if (local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var10._M_pi = extraout_RDX_00;
  }
  if ((DefUseChain *)peVar5 != (DefUseChain *)0x0) goto LAB_0016dd55;
  sVar12 = ir::dycGlobalReg((ir *)&local_40,(shared_ptr<mocker::ir::Addr> *)addr);
  peVar5 = local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var10 = sVar12.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((DefUseChain *)
      local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (DefUseChain *)0x0) {
    local_50._0_4_ = Leaf;
    this->bb = (BasicBlock *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::detail::ReassociationImpl::Node,std::allocator<mocker::detail::ReassociationImpl::Node>,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->func,(Node **)this,
               (allocator<mocker::detail::ReassociationImpl::Node> *)&local_51,(Type *)local_50,
               (shared_ptr<mocker::ir::Reg> *)&local_40);
    _Var10._M_pi = extraout_RDX_01;
  }
  if (local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var10._M_pi = extraout_RDX_02;
  }
  if ((DefUseChain *)peVar5 != (DefUseChain *)0x0) goto LAB_0016dd55;
  ir::dycLocalReg((ir *)&local_40,(shared_ptr<mocker::ir::Addr> *)addr);
  if ((DefUseChain *)
      local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (DefUseChain *)0x0) {
    __assert_fail("reg",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/reassociation.cpp"
                  ,0x41,
                  "std::shared_ptr<detail::ReassociationImpl::Node> mocker::detail::ReassociationImpl::buildTrees(const std::shared_ptr<ir::Addr> &, bool)"
                 );
  }
  bVar6 = isParameter((FunctionModule *)
                      (node->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount._M_pi,
                      (string *)
                      &(((RegMap<std::vector<Use>_> *)
                        &(local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->_vptr_Addr)->_M_h)._M_bucket_count);
  if ((bVar6) ||
     (iVar7 = std::__cxx11::string::compare
                        ((char *)&(((RegMap<std::vector<Use>_> *)
                                   &(local_40.
                                     super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_vptr_Addr)->_M_h)._M_bucket_count), iVar7 == 0)) {
    local_50._0_4_ = Leaf;
    this->bb = (BasicBlock *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::detail::ReassociationImpl::Node,std::allocator<mocker::detail::ReassociationImpl::Node>,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->func,(Node **)this,
               (allocator<mocker::detail::ReassociationImpl::Node> *)&local_51,(Type *)local_50,
               (shared_ptr<mocker::ir::Reg> *)&local_40);
    _Var10._M_pi = extraout_RDX_04;
  }
  else if ((in_CL == '\0') &&
          (cVar8 = std::
                   _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Reg>,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>,_std::__detail::_Identity,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find((_Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::ir::Reg>,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>,_std::__detail::_Identity,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)(node + 2),(key_type *)&local_40),
          cVar8.super__Node_iterator_base<std::shared_ptr<mocker::ir::Reg>,_true>._M_cur !=
          (__node_type *)0x0)) {
    local_50._0_4_ = Root;
    this->bb = (BasicBlock *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::detail::ReassociationImpl::Node,std::allocator<mocker::detail::ReassociationImpl::Node>,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->func,(Node **)this,
               (allocator<mocker::detail::ReassociationImpl::Node> *)&local_51,(Type *)local_50,
               (shared_ptr<mocker::ir::Reg> *)&local_40);
    _Var10._M_pi = extraout_RDX_03;
  }
  else {
    cVar9 = std::
            _Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)node[1].super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi,(key_type *)&local_40);
    if (cVar9.
        super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::__throw_out_of_range("_Map_base::at");
    }
    pp_Var1 = *(_func_int ***)
               ((long)cVar9.
                      super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_true>
                      ._M_cur + 0x18);
    lVar2 = *(long *)((long)cVar9.
                            super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_true>
                            ._M_cur + 0x20);
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)cVar9.
                      super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_true>
                      ._M_cur + 0x28);
    cVar4 = (char)lVar2;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (pp_Var1 !=
          ((node->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          _vptr_Addr) goto LAB_0016dde6;
      iVar7 = *(int *)(lVar2 + 8);
      if (iVar7 == 3) goto LAB_0016df49;
      if (iVar7 == 4) goto LAB_0016deb6;
      if (iVar7 == 5) goto LAB_0016dfa8;
LAB_0016de50:
      local_50._0_4_ = Leaf;
      this->bb = (BasicBlock *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::detail::ReassociationImpl::Node,std::allocator<mocker::detail::ReassociationImpl::Node>,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->func,(Node **)this,
                 (allocator<mocker::detail::ReassociationImpl::Node> *)&local_51,(Type *)local_50,
                 (shared_ptr<mocker::ir::Reg> *)&local_40);
      _Var10._M_pi = extraout_RDX_07;
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0016dd46;
LAB_0016e096:
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
LAB_0016e09e:
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var10._M_pi = extraout_RDX_14;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      if (pp_Var1 ==
          ((node->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          _vptr_Addr) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        iVar7 = *(int *)(lVar2 + 8);
        if (iVar7 == 3) {
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
LAB_0016df49:
          local_50._0_4_ = Assign;
          this->bb = (BasicBlock *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::detail::ReassociationImpl::Node,std::allocator<mocker::detail::ReassociationImpl::Node>,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->func,(Node **)this,
                     (allocator<mocker::detail::ReassociationImpl::Node> *)&local_51,
                     (Type *)local_50,(shared_ptr<mocker::ir::Reg> *)&local_40);
          pBVar3 = this->bb;
          buildTrees((ReassociationImpl *)local_50,node,(bool)(cVar4 + '('));
          std::
          vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
          ::emplace_back<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>
                    ((vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
                      *)&(pBVar3->insts).
                         super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                         ._M_impl._M_node._M_size,
                     (shared_ptr<mocker::detail::ReassociationImpl::Node> *)local_50);
          _Var10._M_pi = extraout_RDX_10;
LAB_0016e04c:
          if ((FunctionModule *)local_50._8_8_ != (FunctionModule *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
            _Var10._M_pi = extraout_RDX_12;
          }
        }
        else if (iVar7 == 4) {
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
LAB_0016deb6:
          if (*(int *)(lVar2 + 0x28) == 0) {
            local_50._0_4_ = Neg;
            this->bb = (BasicBlock *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::detail::ReassociationImpl::Node,std::allocator<mocker::detail::ReassociationImpl::Node>,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->func,(Node **)this,
                       (allocator<mocker::detail::ReassociationImpl::Node> *)&local_51,
                       (Type *)local_50,(shared_ptr<mocker::ir::Reg> *)&local_40);
            pBVar3 = this->bb;
            buildTrees((ReassociationImpl *)local_50,node,(bool)(cVar4 + '0'));
            std::
            vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
            ::emplace_back<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>
                      ((vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
                        *)&(pBVar3->insts).
                           super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                           ._M_impl._M_node._M_size,
                       (shared_ptr<mocker::detail::ReassociationImpl::Node> *)local_50);
            _Var10._M_pi = extraout_RDX_09;
            goto LAB_0016e04c;
          }
          local_50._0_4_ = Leaf;
          this->bb = (BasicBlock *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::detail::ReassociationImpl::Node,std::allocator<mocker::detail::ReassociationImpl::Node>,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->func,(Node **)this,
                     (allocator<mocker::detail::ReassociationImpl::Node> *)&local_51,
                     (Type *)local_50,(shared_ptr<mocker::ir::Reg> *)&local_40);
          _Var10._M_pi = extraout_RDX_08;
        }
        else {
          if (iVar7 != 5) goto LAB_0016de50;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
LAB_0016dfa8:
          if (*(int *)(lVar2 + 0x28) - 5U < 2) {
            local_50._0_4_ = (*(int *)(lVar2 + 0x28) != 5) + Add;
            this->bb = (BasicBlock *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::detail::ReassociationImpl::Node,std::allocator<mocker::detail::ReassociationImpl::Node>,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->func,(Node **)this,
                       (allocator<mocker::detail::ReassociationImpl::Node> *)&local_51,
                       (Type *)local_50,(shared_ptr<mocker::ir::Reg> *)&local_40);
            pBVar3 = this->bb;
            buildTrees((ReassociationImpl *)local_50,node,(bool)(cVar4 + '0'));
            std::
            vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
            ::emplace_back<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>
                      ((vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
                        *)&(pBVar3->insts).
                           super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                           ._M_impl._M_node._M_size,
                       (shared_ptr<mocker::detail::ReassociationImpl::Node> *)local_50);
            if ((FunctionModule *)local_50._8_8_ != (FunctionModule *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
            }
            pBVar3 = this->bb;
            buildTrees((ReassociationImpl *)local_50,node,(bool)(cVar4 + '@'));
            std::
            vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
            ::emplace_back<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>
                      ((vector<std::shared_ptr<mocker::detail::ReassociationImpl::Node>,std::allocator<std::shared_ptr<mocker::detail::ReassociationImpl::Node>>>
                        *)&(pBVar3->insts).
                           super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                           ._M_impl._M_node._M_size,
                       (shared_ptr<mocker::detail::ReassociationImpl::Node> *)local_50);
            _Var10._M_pi = extraout_RDX_11;
            goto LAB_0016e04c;
          }
          local_50._0_4_ = Leaf;
          this->bb = (BasicBlock *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::detail::ReassociationImpl::Node,std::allocator<mocker::detail::ReassociationImpl::Node>,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->func,(Node **)this,
                     (allocator<mocker::detail::ReassociationImpl::Node> *)&local_51,
                     (Type *)local_50,(shared_ptr<mocker::ir::Reg> *)&local_40);
          _Var10._M_pi = extraout_RDX_13;
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          goto LAB_0016e096;
        }
      }
      else {
LAB_0016dde6:
        local_50._0_4_ = Leaf;
        this->bb = (BasicBlock *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::detail::ReassociationImpl::Node,std::allocator<mocker::detail::ReassociationImpl::Node>,mocker::detail::ReassociationImpl::Node::Type,std::shared_ptr<mocker::ir::Reg>&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->func,(Node **)this,
                   (allocator<mocker::detail::ReassociationImpl::Node> *)&local_51,(Type *)local_50,
                   (shared_ptr<mocker::ir::Reg> *)&local_40);
        _Var10._M_pi = extraout_RDX_06;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0016e09e;
      }
    }
  }
LAB_0016dd46:
  if (local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var10._M_pi = extraout_RDX_05;
  }
LAB_0016dd55:
  sVar13.super___shared_ptr<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var10._M_pi;
  sVar13.super___shared_ptr<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<mocker::detail::ReassociationImpl::Node>)
         sVar13.
         super___shared_ptr<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<detail::ReassociationImpl::Node>
detail::ReassociationImpl::buildTrees(const std::shared_ptr<ir::Addr> &node,
                                      bool firstNode) {
  if (auto lit = ir::dyc<ir::IntLiteral>(node)) {
    return std::make_shared<Node>(Node::Literal, lit);
  }
  if (auto gReg = ir::dycGlobalReg(node)) {
    return std::make_shared<Node>(Node::Leaf, gReg);
  }

  auto reg = ir::dycLocalReg(node);
  assert(reg);
  if (isParameter(func, reg->getIdentifier()) ||
      reg->getIdentifier() == ".phi_nan") {
    return std::make_shared<Node>(Node::Leaf, reg);
  }

  if (!firstNode && isIn(roots, reg)) {
    return std::make_shared<Node>(Node::Root, reg);
  }

  auto def = useDef.getDef(reg);
  if (def.getBBLabel() != bb.getLabelID()) {
    return std::make_shared<Node>(Node::Leaf, reg);
  }

  auto inst = def.getInst();
  if (auto binary = ir::dyc<ir::ArithBinaryInst>(inst)) {
    if (binary->getOp() != ir::ArithBinaryInst::Add &&
        binary->getOp() != ir::ArithBinaryInst::Sub) {
      return std::make_shared<Node>(Node::Leaf, reg);
    }
    auto res = std::make_shared<Node>(
        binary->getOp() == ir::ArithBinaryInst::Add ? Node::Add : Node::Sub,
        reg);
    res->children.emplace_back(buildTrees(binary->getLhs(), false));
    res->children.emplace_back(buildTrees(binary->getRhs(), false));
    return res;
  }

  if (auto unary = ir::dyc<ir::ArithUnaryInst>(inst)) {
    if (unary->getOp() != ir::ArithUnaryInst::Neg)
      return std::make_shared<Node>(Node::Leaf, reg);
    auto res = std::make_shared<Node>(Node::Neg, reg);
    res->children.emplace_back(buildTrees(unary->getOperand(), false));
    return res;
  }

  if (auto assign = ir::dyc<ir::Assign>(inst)) {
    auto res = std::make_shared<Node>(Node::Assign, reg);
    res->children.emplace_back(buildTrees(assign->getOperand(), false));
    return res;
  }

  return std::make_shared<Node>(Node::Leaf, reg);
}